

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Track::VetEntry(Track *this,BlockEntry *pBlockEntry)

{
  int iVar1;
  undefined4 extraout_var;
  longlong lVar2;
  Block *pBlock;
  BlockEntry *pBlockEntry_local;
  Track *this_local;
  Block *this_00;
  
  if (pBlockEntry == (BlockEntry *)0x0) {
    __assert_fail("pBlockEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x12ca,"virtual bool mkvparser::Track::VetEntry(const BlockEntry *) const");
  }
  iVar1 = (*pBlockEntry->_vptr_BlockEntry[2])();
  this_00 = (Block *)CONCAT44(extraout_var,iVar1);
  if (this_00 == (Block *)0x0) {
    __assert_fail("pBlock",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x12cc,"virtual bool mkvparser::Track::VetEntry(const BlockEntry *) const");
  }
  lVar2 = Block::GetTrackNumber(this_00);
  if (lVar2 != (this->m_info).number) {
    __assert_fail("pBlock->GetTrackNumber() == m_info.number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x12cd,"virtual bool mkvparser::Track::VetEntry(const BlockEntry *) const");
  }
  if ((this_00 != (Block *)0x0) &&
     (lVar2 = Block::GetTrackNumber(this_00), lVar2 == (this->m_info).number)) {
    return true;
  }
  return false;
}

Assistant:

bool Track::VetEntry(const BlockEntry* pBlockEntry) const {
  assert(pBlockEntry);
  const Block* const pBlock = pBlockEntry->GetBlock();
  assert(pBlock);
  assert(pBlock->GetTrackNumber() == m_info.number);
  if (!pBlock || pBlock->GetTrackNumber() != m_info.number)
    return false;

  // This function is used during a seek to determine whether the
  // frame is a valid seek target.  This default function simply
  // returns true, which means all frames are valid seek targets.
  // It gets overridden by the VideoTrack class, because only video
  // keyframes can be used as seek target.

  return true;
}